

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int check_router_keys(rtr_signature_seg *sig_segs,spki_table *table)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  rtr_signature_seg *prStack_80;
  spki_rtvals spki_retval;
  rtr_signature_seg *curr;
  spki_table *table_local;
  rtr_signature_seg *sig_segs_local;
  spki_record *psStack_60;
  uint router_keys_len;
  spki_record *tmp_key;
  char ski_str [61];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psStack_60 = (spki_record *)0x0;
  prStack_80 = sig_segs;
  do {
    if (prStack_80 == (rtr_signature_seg *)0x0) {
      sig_segs_local._0_4_ = 0;
LAB_0011b50f:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (int)sig_segs_local;
      }
      __stack_chk_fail();
    }
    sig_segs_local._4_4_ = 0;
    iVar2 = spki_table_search_by_ski
                      (table,prStack_80->ski,&stack0xffffffffffffffa0,
                       (uint *)((long)&sig_segs_local + 4));
    if (iVar2 == -1) {
      sig_segs_local._0_4_ = -1;
      goto LAB_0011b50f;
    }
    if (sig_segs_local._4_4_ == 0) {
      memset(&tmp_key,0,0x3d);
      ski_to_char((char *)&tmp_key,prStack_80->ski);
      lrtr_dbg("BGPSEC: ERROR: Could not find router key for SKI: %s",&tmp_key);
      sig_segs_local._0_4_ = -4;
      goto LAB_0011b50f;
    }
    lrtr_free(psStack_60);
    prStack_80 = prStack_80->next;
  } while( true );
}

Assistant:

int check_router_keys(const struct rtr_signature_seg *sig_segs, struct spki_table *table)
{
	struct spki_record *tmp_key = NULL;
	const struct rtr_signature_seg *curr = sig_segs;

	while (curr) {
		unsigned int router_keys_len = 0;
		enum spki_rtvals spki_retval =
			spki_table_search_by_ski(table, (uint8_t *)curr->ski, &tmp_key, &router_keys_len);
		if (spki_retval == SPKI_ERROR)
			return RTR_BGPSEC_ERROR;

		/* Return an error, if a router key was not found. */
		if (router_keys_len == 0) {
			char ski_str[SKI_STR_LEN] = {0};

			ski_to_char(ski_str, (uint8_t *)curr->ski);
			BGPSEC_DBG("ERROR: Could not find router key for SKI: %s", ski_str);
			return RTR_BGPSEC_ROUTER_KEY_NOT_FOUND;
		}
		lrtr_free(tmp_key);
		curr = curr->next;
	}

	return RTR_BGPSEC_SUCCESS;
}